

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_kotlin.cpp
# Opt level: O3

string * flatbuffers::kotlin::KotlinGenerator::CastToUsigned_abi_cxx11_(Type type)

{
  int iVar1;
  int iVar2;
  string *in_RDI;
  int in_stack_00000008;
  int in_stack_0000000c;
  
  iVar1 = in_stack_0000000c;
  do {
    in_stack_0000000c = iVar1;
    iVar2 = in_stack_00000008;
    in_stack_00000008 = in_stack_0000000c;
    iVar1 = 0;
  } while (iVar2 == 0xe);
  switch(iVar2) {
  case 1:
  case 4:
    (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
    break;
  default:
    (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
    break;
  case 6:
    (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
    break;
  case 8:
    (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
    break;
  case 10:
    (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  }
  std::__cxx11::string::_M_construct<char_const*>();
  return in_RDI;
}

Assistant:

static std::string CastToUsigned(const Type type) {
    switch (type.base_type) {
      case BASE_TYPE_UINT: return ".toUInt()";
      case BASE_TYPE_UCHAR:
      case BASE_TYPE_UTYPE: return ".toUByte()";
      case BASE_TYPE_USHORT: return ".toUShort()";
      case BASE_TYPE_ULONG: return ".toULong()";
      case BASE_TYPE_VECTOR: return CastToUsigned(type.VectorType());
      default: return "";
    }
  }